

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O1

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::finish
          (Fasttrack<std::shared_mutex> *this,tls_t tls,tid_t thread_id)

{
  shared_mutex *__rwlock;
  int iVar1;
  undefined8 uVar2;
  tid_t local_18;
  
  __rwlock = &this->g_lock;
  local_18 = thread_id;
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  if (iVar1 != 0x23) {
    phmap::container_internal::
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
    ::erase<unsigned_long>
              ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                *)&this->threads,&local_18);
    cleanup(this,(EVP_PKEY_CTX *)(local_18 & 0xffffffff));
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    return;
  }
  uVar2 = std::__throw_system_error(0x23);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  _Unwind_Resume(uVar2);
}

Assistant:

void finish(tls_t tls, tid_t thread_id) final {
    std::lock_guard<LockT> exLockT(g_lock);
    /// just delete thread from list, no backward sync needed
    threads.erase(thread_id);
    cleanup(thread_id);
  }